

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTsim.c
# Opt level: O3

void Gia_ManTerDelete(Gia_ManTer_t *p)

{
  Vec_Int_t *__ptr;
  int *__ptr_00;
  
  if (p->vStates != (Vec_Ptr_t *)0x0) {
    Gia_ManTerStatesFree(p->vStates);
  }
  if (p->vFlops != (Vec_Ptr_t *)0x0) {
    Gia_ManTerStatesFree(p->vFlops);
  }
  Gia_ManStop(p->pAig);
  __ptr = p->vRetired;
  __ptr_00 = __ptr->pArray;
  if (__ptr_00 != (int *)0x0) {
    free(__ptr_00);
  }
  free(__ptr);
  if (p->pRetired != (char *)0x0) {
    free(p->pRetired);
    p->pRetired = (char *)0x0;
  }
  if (p->pCount0 != (int *)0x0) {
    free(p->pCount0);
    p->pCount0 = (int *)0x0;
  }
  if (p->pCountX != (int *)0x0) {
    free(p->pCountX);
    p->pCountX = (int *)0x0;
  }
  if (p->pBins != (uint **)0x0) {
    free(p->pBins);
    p->pBins = (uint **)0x0;
  }
  if (p->pDataSim != (uint *)0x0) {
    free(p->pDataSim);
    p->pDataSim = (uint *)0x0;
  }
  if (p->pDataSimCis != (uint *)0x0) {
    free(p->pDataSimCis);
    p->pDataSimCis = (uint *)0x0;
  }
  if (p->pDataSimCos != (uint *)0x0) {
    free(p->pDataSimCos);
  }
  free(p);
  return;
}

Assistant:

void Gia_ManTerDelete( Gia_ManTer_t * p )
{
    if ( p->vStates ) 
        Gia_ManTerStatesFree( p->vStates );
    if ( p->vFlops ) 
        Gia_ManTerStatesFree( p->vFlops );
    Gia_ManStop( p->pAig );
    Vec_IntFree( p->vRetired );
    ABC_FREE( p->pRetired );
    ABC_FREE( p->pCount0 );
    ABC_FREE( p->pCountX );
    ABC_FREE( p->pBins );
    ABC_FREE( p->pDataSim );
    ABC_FREE( p->pDataSimCis );
    ABC_FREE( p->pDataSimCos );
    ABC_FREE( p );
}